

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseStats::TestCaseStats(TestCaseStats *this,TestCaseStats *param_1)

{
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00571e60;
  TestCaseInfo::TestCaseInfo(&this->testInfo,&param_1->testInfo);
  Totals::Totals(&this->totals,&param_1->totals);
  std::__cxx11::string::string((string *)&this->stdOut,(string *)&param_1->stdOut);
  std::__cxx11::string::string((string *)&this->stdErr,(string *)&param_1->stdErr);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestCaseStats( TestCaseStats const& )              = default;